

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int set_snode_dup_node_check(lyxp_set *set,lys_node *node,lyxp_node_type node_type,int skip_idx)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = 8;
  uVar1 = 0;
  while( true ) {
    if (set->used <= uVar1) {
      return -1;
    }
    if (((skip_idx < 0 || (uint)skip_idx != uVar1) &&
        (*(lys_node **)((long)(set->val).nodes + lVar2 + -8) == node)) &&
       (*(lyxp_node_type *)((long)&((set->val).nodes)->node + lVar2) == node_type)) break;
    uVar1 = uVar1 + 1;
    lVar2 = lVar2 + 0x10;
  }
  return (int)uVar1;
}

Assistant:

static int
set_snode_dup_node_check(struct lyxp_set *set, const struct lys_node *node, enum lyxp_node_type node_type, int skip_idx)
{
    uint32_t i;

    for (i = 0; i < set->used; ++i) {
        if ((skip_idx > -1) && (i == (unsigned)skip_idx)) {
            continue;
        }

        if ((set->val.snodes[i].snode == node) && (set->val.snodes[i].type == node_type)) {
            return i;
        }
    }

    return -1;
}